

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O0

int retrieveDeviceMethodRidInfo(char *resp_topic,STRING_HANDLE method_name,STRING_HANDLE request_id)

{
  int iVar1;
  STRING_TOKENIZER_HANDLE_conflict tokenizer;
  LOGGER_LOG p_Var2;
  STRING_HANDLE output;
  size_t sVar3;
  char *__s1;
  LOGGER_LOG l_3;
  char *request_id_value;
  LOGGER_LOG l_2;
  size_t request_id_length;
  size_t token_index;
  LOGGER_LOG l_1;
  STRING_HANDLE token_value;
  LOGGER_LOG l;
  STRING_TOKENIZER_HANDLE token_handle;
  int result;
  STRING_HANDLE request_id_local;
  STRING_HANDLE method_name_local;
  char *resp_topic_local;
  
  tokenizer = STRING_TOKENIZER_create_from_char(resp_topic);
  if (tokenizer == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"retrieveDeviceMethodRidInfo",0x1f8,1,
                "Failed creating token from device twin topic.");
    }
    token_handle._4_4_ = 0x1f9;
  }
  else {
    output = STRING_new();
    if (output == (STRING_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                  ,"retrieveDeviceMethodRidInfo",0x200,1,"Failed allocating new string .");
      }
      token_handle._4_4_ = 0x201;
    }
    else {
      request_id_length = 0;
      token_handle._4_4_ = 0x207;
      while (iVar1 = STRING_TOKENIZER_get_next_token(tokenizer,output,"/"), iVar1 == 0) {
        if (request_id_length == 3) {
          iVar1 = STRING_concat_with_STRING(method_name,output);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                        ,"retrieveDeviceMethodRidInfo",0x20e,1,"Failed STRING_concat_with_STRING.");
            }
            token_handle._4_4_ = 0x20f;
            break;
          }
        }
        else if ((request_id_length == 4) && (sVar3 = STRING_length(output), 5 < sVar3)) {
          __s1 = STRING_c_str(output);
          iVar1 = memcmp(__s1,"?$rid=",6);
          if (iVar1 == 0) {
            iVar1 = STRING_concat(request_id,__s1 + 6);
            if (iVar1 == 0) {
              token_handle._4_4_ = 0;
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                          ,"retrieveDeviceMethodRidInfo",0x21c,1,"Failed STRING_concat failed.");
              }
              token_handle._4_4_ = 0x21d;
            }
            break;
          }
        }
        request_id_length = request_id_length + 1;
      }
      STRING_delete(output);
    }
    STRING_TOKENIZER_destroy(tokenizer);
  }
  return token_handle._4_4_;
}

Assistant:

static int retrieveDeviceMethodRidInfo(const char* resp_topic, STRING_HANDLE method_name, STRING_HANDLE request_id)
{
    int result;

    STRING_TOKENIZER_HANDLE token_handle = STRING_TOKENIZER_create_from_char(resp_topic);
    if (token_handle == NULL)
    {
        LogError("Failed creating token from device twin topic.");
        result = MU_FAILURE;
    }
    else
    {
        STRING_HANDLE token_value;
        if ((token_value = STRING_new()) == NULL)
        {
            LogError("Failed allocating new string .");
            result = MU_FAILURE;
        }
        else
        {
            size_t token_index = 0;
            size_t request_id_length = strlen(REQUEST_ID_PROPERTY);
            result = MU_FAILURE;
            while (STRING_TOKENIZER_get_next_token(token_handle, token_value, "/") == 0)
            {
                if (token_index == 3)
                {
                    if (STRING_concat_with_STRING(method_name, token_value) != 0)
                    {
                        LogError("Failed STRING_concat_with_STRING.");
                        result = MU_FAILURE;
                        break;
                    }
                }
                else if (token_index == 4)
                {
                    if (STRING_length(token_value) >= request_id_length)
                    {
                        const char* request_id_value = STRING_c_str(token_value);
                        if (memcmp(request_id_value, REQUEST_ID_PROPERTY, request_id_length) == 0)
                        {
                            if (STRING_concat(request_id, request_id_value + request_id_length) != 0)
                            {
                                LogError("Failed STRING_concat failed.");
                                result = MU_FAILURE;
                            }
                            else
                            {
                                result = 0;
                            }
                            break;
                        }
                    }
                }
                token_index++;
            }
            STRING_delete(token_value);
        }
        STRING_TOKENIZER_destroy(token_handle);
    }

    return result;
}